

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

CreateMultisigResponse * __thiscall
cfd::js::api::json::CreateMultisigResponse::GetAddressString_abi_cxx11_
          (CreateMultisigResponse *this,CreateMultisigResponse *obj)

{
  CreateMultisigResponse *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->address_);
  return this;
}

Assistant:

static std::string GetAddressString(  // line separate
      const CreateMultisigResponse& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.address_);
  }